

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O2

void __thiscall DPolyobjInterpolation::Restore(DPolyobjInterpolation *this)

{
  double *pdVar1;
  uint uVar2;
  FPolyObj *this_00;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  ulong uVar6;
  
  this_00 = this->poly;
  pdVar3 = (this->bakverts).Array;
  uVar2 = (this_00->Vertices).Count;
  for (uVar6 = 0; (ulong)uVar2 * 2 != uVar6; uVar6 = uVar6 + 2) {
    pdVar4 = *(double **)((long)(this_00->Vertices).Array + uVar6 * 4);
    pdVar1 = pdVar3 + (uVar6 & 0xffffffff);
    dVar5 = pdVar1[1];
    *pdVar4 = *pdVar1;
    pdVar4[1] = dVar5;
  }
  dVar5 = this->bakcy;
  (this_00->CenterSpot).pos.X = this->bakcx;
  (this_00->CenterSpot).pos.Y = dVar5;
  FPolyObj::ClearSubsectorLinks(this_00);
  return;
}

Assistant:

void DPolyobjInterpolation::Restore()
{
	for(unsigned int i = 0; i < poly->Vertices.Size(); i++)
	{
		poly->Vertices[i]->set(bakverts[i*2  ], bakverts[i*2+1]);
	}
	poly->CenterSpot.pos.X = bakcx;
	poly->CenterSpot.pos.Y = bakcy;
	poly->ClearSubsectorLinks();
}